

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_override_short_usage(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  cargo_t cargo;
  int b;
  int a;
  cargo_t local_28;
  undefined4 local_20;
  undefined4 local_1c;
  
  iVar1 = cargo_init(&local_28,0,"program");
  if (iVar1 == 0) {
    local_1c = 0;
    local_20 = 0;
    cargo_add_option(local_28,CARGO_OPT_HIDE,"--alpha","the hidden","i");
    iVar1 = cargo_add_option(local_28,0,"--beta -b","an option","i",&local_20);
    if (iVar1 == 0) {
      cargo_set_progname(local_28,"%s [options] args","program");
      pcVar2 = cargo_get_usage(local_28,CARGO_USAGE_OVERRIDE_SHORT|CARGO_USAGE_SHORT);
      puts(pcVar2);
      pcVar3 = strstr(pcVar2,"--help");
      if (pcVar3 == (char *)0x0) {
        pcVar3 = strstr(pcVar2,"--beta");
        if (pcVar3 == (char *)0x0) {
          iVar1 = strcmp(pcVar2,"Usage: program [options] args");
          if (iVar1 == 0) {
            cargo_set_progname(local_28,"%s [options] args","some/long/path/program");
            pcVar2 = cargo_get_usage(local_28,CARGO_USAGE_OVERRIDE_SHORT|CARGO_USAGE_SHORT);
            printf("STRIP:\n%s\n",pcVar2);
            pcVar2 = strstr(pcVar2,"some/long/path/");
            if (pcVar2 == (char *)0x0) {
              pcVar2 = cargo_get_usage(local_28,CARGO_USAGE_NO_STRIP_PROGNAME|
                                                CARGO_USAGE_OVERRIDE_SHORT|CARGO_USAGE_SHORT);
              pcVar3 = (char *)0x0;
              printf("NO STRIP:\n%s\n",pcVar2);
              pcVar2 = strstr(pcVar2,"some/long/path/");
              if (pcVar2 == (char *)0x0) {
                pcVar3 = "Did not find path when no strip";
              }
            }
            else {
              pcVar3 = "Found path when stripping";
            }
          }
          else {
            pcVar3 = "Did not find overriden short usage";
          }
        }
        else {
          pcVar3 = "Short usage not overridden, found --beta";
        }
      }
      else {
        pcVar3 = "Short usage not overridden, found --help";
      }
    }
    else {
      pcVar3 = "Failed to add options";
    }
    cargo_destroy(&local_28);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_override_short_usage)
{
    char *args[] = { "program", "--alpha", "123", "--centauri", "--beta", "3" };
    int a = 0;
    int b = 0;
    const char *usage = NULL;
    ret = cargo_add_option(cargo, CARGO_OPT_HIDE, "--alpha", "the hidden", "i", &a);
    ret = cargo_add_option(cargo, 0, "--beta -b", "an option", "i", &b);
    cargo_assert(ret == 0, "Failed to add options");

    cargo_set_progname(cargo, "%s [options] args", args[0]);
    usage = cargo_get_usage(cargo,
        CARGO_USAGE_OVERRIDE_SHORT |
        CARGO_USAGE_SHORT);
    printf("%s\n", usage);

    cargo_assert(strstr(usage, "--help") == NULL,
        "Short usage not overridden, found --help");

    cargo_assert(strstr(usage, "--beta") == NULL,
        "Short usage not overridden, found --beta");

    cargo_assert(!strcmp(usage, "Usage: program [options] args"),
        "Did not find overriden short usage");

    // Test stripping path. First no strip.
    cargo_set_progname(cargo, "%s [options] args", "some/long/path/program");
    usage = cargo_get_usage(cargo,
        CARGO_USAGE_OVERRIDE_SHORT |
        CARGO_USAGE_SHORT);
    printf("STRIP:\n%s\n", usage);

    cargo_assert(strstr(usage, "some/long/path/") == NULL,
        "Found path when stripping");

    usage = cargo_get_usage(cargo,
        CARGO_USAGE_NO_STRIP_PROGNAME |
        CARGO_USAGE_OVERRIDE_SHORT |
        CARGO_USAGE_SHORT);
    printf("NO STRIP:\n%s\n", usage);

    cargo_assert(strstr(usage, "some/long/path/"),
        "Did not find path when no strip");

    _TEST_CLEANUP();
}